

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada_info.h
# Opt level: O0

void __thiscall CMU462::Collada::Node::Node(Node *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  Matrix4x4::identity();
  return;
}

Assistant:

Node() : instance(nullptr), transform(Matrix4x4::identity()) {}